

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::owords_cmd(int cid,char **args,int argc)

{
  int cn;
  size_t sVar1;
  int local_438;
  char local_432 [2];
  int i;
  char colors [10];
  char owordList [1024];
  int argc_local;
  char **args_local;
  int cid_local;
  
  memcpy(colors + 2,"Offensive words (words not to say): ",0x400);
  for (local_438 = 0; local_438 < 0x32; local_438 = local_438 + 1) {
    sVar1 = strlen(owords[local_438]);
    if (sVar1 != 0) {
      sprintf(local_432,"\f%d",3);
      strcat(colors + 2,local_432);
      strcat(colors + 2,owords[local_438]);
      strcat(colors + 2,"\f2, ");
    }
  }
  sVar1 = strlen(colors + 2);
  colors[sVar1] = '\0';
  cn = QServ::getSender(&qs);
  sendf(cn,1,"ris",0x23,colors + 2);
  return;
}

Assistant:

QSERV_CALLBACK owords_cmd(p) {
        char owordList[1024] = "Offensive words (words not to say): ";
        char colors[10];

        for(int i = 0; i < 50; i++) {
            if(strlen(owords[i]) > 0) {
                sprintf(colors, "\f%d", 3);
                strcat(owordList, colors);
                strcat(owordList, owords[i]);
                strcat(owordList, "\f2, ");
            }
        }
        owordList[strlen(owordList)-2] = '\0';
        sendf(CMD_SENDER, 1, "ris", N_SERVMSG, owordList);
    }